

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::TestCaseInfo::TestCaseInfo
          (TestCaseInfo *this,ITestCase *testCase,string *className,string *name,string *description
          ,SourceLineInfo *lineInfo)

{
  string *str;
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  int iVar3;
  const_iterator cVar4;
  bool bVar5;
  key_type local_b8;
  undefined1 local_98;
  undefined7 uStack_97;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  long *local_68;
  ulong local_60;
  long local_58 [2];
  SourceLineInfo *local_48;
  string *local_40;
  string *local_38;
  
  (this->m_test).m_p = testCase;
  if (testCase != (ITestCase *)0x0) {
    (*(testCase->super_IShared).super_NonCopyable._vptr_NonCopyable[2])(testCase);
  }
  local_70 = &(this->m_className).field_2;
  (this->m_className)._M_dataplus._M_p = (pointer)local_70;
  pcVar2 = (className->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_className,pcVar2,pcVar2 + className->_M_string_length);
  local_40 = &this->m_name;
  local_78 = &(this->m_name).field_2;
  (this->m_name)._M_dataplus._M_p = (pointer)local_78;
  pcVar2 = (name->_M_dataplus)._M_p;
  local_38 = &this->m_className;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar2,pcVar2 + name->_M_string_length);
  str = &this->m_description;
  local_80 = &(this->m_description).field_2;
  (this->m_description)._M_dataplus._M_p = (pointer)local_80;
  pcVar2 = (description->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)str,pcVar2,pcVar2 + description->_M_string_length);
  p_Var1 = &(this->m_tags)._M_t._M_impl.super__Rb_tree_header;
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88 = &(this->m_lineInfo).file.field_2;
  (this->m_lineInfo).file._M_dataplus._M_p = (pointer)local_88;
  pcVar2 = (lineInfo->file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_lineInfo,pcVar2,pcVar2 + (lineInfo->file)._M_string_length);
  (this->m_lineInfo).line = lineInfo->line;
  local_68 = local_58;
  local_48 = &this->m_lineInfo;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"./","");
  if (name->_M_string_length < local_60) {
    bVar5 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_b8,(ulong)name);
    if (local_b8._M_string_length == local_60) {
      if (local_b8._M_string_length == 0) {
        bVar5 = true;
      }
      else {
        iVar3 = bcmp(local_b8._M_dataplus._M_p,local_68,local_b8._M_string_length);
        bVar5 = iVar3 == 0;
      }
    }
    else {
      bVar5 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  this->m_isHidden = bVar5;
  local_b8._M_dataplus._M_p = (pointer)&PTR__TagExtracter_001d52b0;
  local_b8.field_2._8_8_ = 0;
  local_98 = 0;
  local_b8._M_string_length = (size_type)&this->m_tags;
  local_b8.field_2._M_allocated_capacity = (size_type)&local_98;
  TagParser::parse((TagParser *)&local_b8,str);
  std::__cxx11::string::_M_assign((string *)str);
  local_b8._M_dataplus._M_p = (pointer)&PTR__TagExtracter_001d52b0;
  if ((undefined1 *)local_b8.field_2._M_allocated_capacity != &local_98) {
    operator_delete((void *)local_b8.field_2._M_allocated_capacity,CONCAT71(uStack_97,local_98) + 1)
    ;
  }
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"hide","");
  cVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->m_tags)._M_t,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,(ulong)(local_b8.field_2._M_allocated_capacity + 1));
  }
  if ((_Rb_tree_header *)cVar4._M_node != p_Var1) {
    this->m_isHidden = true;
  }
  return;
}

Assistant:

TestCaseInfo::TestCaseInfo( ITestCase* testCase,
                                const std::string& className,
                                const std::string& name,
                                const std::string& description,
                                const SourceLineInfo& lineInfo )
    :   m_test( testCase ),
        m_className( className ),
        m_name( name ),
        m_description( description ),
        m_lineInfo( lineInfo ),
        m_isHidden( startsWith( name, "./" ) )
    {
        TagExtracter( m_tags ).parse( m_description );
        if( hasTag( "hide" ) )
            m_isHidden = true;
    }